

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O3

Aig_Obj_t *
Saig_StrSimTableLookup(Aig_Obj_t **ppTable,Aig_Obj_t **ppNexts,int nTableSize,Aig_Obj_t *pObj)

{
  int *piVar1;
  undefined1 auVar2 [16];
  long lVar3;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  lVar3 = 0;
  do {
    piVar1 = (int *)((long)(pObj->field_5).pData + lVar3);
    auVar2 = *(undefined1 (*) [16])((long)Saig_StrSimHash::s_SPrimes + lVar3);
    uVar5 = uVar5 ^ auVar2._0_4_ * *piVar1;
    uVar6 = uVar6 ^ auVar2._4_4_ * piVar1[1];
    uVar7 = uVar7 ^ (uint)((auVar2._8_8_ & 0xffffffff) * (ulong)(uint)piVar1[2]);
    uVar8 = uVar8 ^ auVar2._12_4_ * piVar1[3];
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  pAVar4 = ppTable[(int)((uVar8 ^ uVar6 ^ uVar7 ^ uVar5) % (uint)nTableSize)];
  do {
    if (pAVar4 == (Aig_Obj_t *)0x0) {
      return (Aig_Obj_t *)0x0;
    }
    lVar3 = 0;
    while (*(int *)((long)(pAVar4->field_5).pData + lVar3 * 4) ==
           *(int *)((long)(pObj->field_5).pData + lVar3 * 4)) {
      lVar3 = lVar3 + 1;
      if (lVar3 == 0x10) {
        return pAVar4;
      }
    }
    pAVar4 = ppNexts[pAVar4->Id];
  } while( true );
}

Assistant:

Aig_Obj_t * Saig_StrSimTableLookup( Aig_Obj_t ** ppTable, Aig_Obj_t ** ppNexts, int nTableSize, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pEntry;
    int iEntry;
    // find the hash entry
    iEntry = Saig_StrSimHash( pObj ) % nTableSize;
    // check if there are nodes with this signatures
    for ( pEntry = ppTable[iEntry]; pEntry; pEntry = Saig_ObjNext(ppNexts,pEntry) )
        if ( Saig_StrSimIsEqual( pEntry, pObj ) )
            return pEntry;
    return NULL;
}